

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Worker.cpp
# Opt level: O2

void __thiscall
adios2::query::Worker::GetResultCoverage
          (Worker *this,Box<adios2::Dims> *outputRegion,
          vector<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
          *touchedBlocks)

{
  QueryBase *pQVar1;
  pointer pBVar2;
  bool bVar3;
  pointer cpy;
  allocator local_ac;
  allocator local_ab;
  allocator local_aa;
  allocator local_a9;
  vector<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_> blockHits;
  BlockHit blk;
  string local_68;
  string local_48;
  
  std::
  vector<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  ::clear(touchedBlocks);
  bVar3 = QueryBase::UseOutputRegion(this->m_Query,outputRegion);
  if (!bVar3) {
    std::__cxx11::string::string((string *)&blk,"Toolkit",&local_a9);
    std::__cxx11::string::string((string *)&blockHits,"query::Worker",&local_aa);
    std::__cxx11::string::string((string *)&local_48,"GetResultCoverage",&local_ab);
    std::__cxx11::string::string((string *)&local_68,"Unable to use the output region",&local_ac);
    helper::Throw<std::invalid_argument>((string *)&blk,(string *)&blockHits,&local_48,&local_68,-1)
    ;
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::~string((string *)&blockHits);
    std::__cxx11::string::~string((string *)&blk);
  }
  pQVar1 = this->m_Query;
  if ((pQVar1 != (QueryBase *)0x0) && (this->m_SourceReader != (Engine *)0x0)) {
    blockHits.super__Vector_base<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    blockHits.super__Vector_base<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    blockHits.super__Vector_base<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (*pQVar1->_vptr_QueryBase[4])(pQVar1,this->m_SourceReader->m_IO);
    pBVar2 = blockHits.
             super__Vector_base<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    for (cpy = blockHits.
               super__Vector_base<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_>
               ._M_impl.super__Vector_impl_data._M_start; cpy != pBVar2; cpy = cpy + 1) {
      BlockHit::BlockHit(&blk,cpy);
      std::
      vector<std::pair<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::vector<unsigned_long,std::allocator<unsigned_long>>>,std::allocator<std::pair<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::vector<unsigned_long,std::allocator<unsigned_long>>>>>
      ::
      insert<__gnu_cxx::__normal_iterator<std::pair<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::vector<unsigned_long,std::allocator<unsigned_long>>>*,std::vector<std::pair<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::vector<unsigned_long,std::allocator<unsigned_long>>>,std::allocator<std::pair<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::vector<unsigned_long,std::allocator<unsigned_long>>>>>>,void>
                ((vector<std::pair<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::vector<unsigned_long,std::allocator<unsigned_long>>>,std::allocator<std::pair<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::vector<unsigned_long,std::allocator<unsigned_long>>>>>
                  *)touchedBlocks,
                 (touchedBlocks->
                 super__Vector_base<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish,
                 (__normal_iterator<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::vector<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                  )blk.m_Regions.
                   super__Vector_base<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,
                 (__normal_iterator<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::vector<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                  )blk.m_Regions.
                   super__Vector_base<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
      std::
      vector<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
      ::~vector(&blk.m_Regions);
    }
    std::vector<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_>::~vector
              (&blockHits);
  }
  return;
}

Assistant:

void Worker::GetResultCoverage(const adios2::Box<adios2::Dims> &outputRegion,
                               std::vector<Box<Dims>> &touchedBlocks)
{
    touchedBlocks.clear();

    if (!m_Query->UseOutputRegion(outputRegion))
    {
        helper::Throw<std::invalid_argument>("Toolkit", "query::Worker", "GetResultCoverage",
                                             "Unable to use the output region");
    }

    if (m_Query && m_SourceReader)
    {
        std::vector<BlockHit> blockHits;
        m_Query->BlockIndexEvaluate(m_SourceReader->m_IO, *m_SourceReader, blockHits);

        for (auto blk : blockHits)
            touchedBlocks.insert(touchedBlocks.end(), blk.m_Regions.begin(), blk.m_Regions.end());
    }
}